

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_for_error.hpp
# Opt level: O0

void check_for_error<InvalidIndex_InsertIntoIndexAtWrongRevision_Test::TestBody()::__0>
               (anon_class_16_2_0e9a3be1 test_fn,int err,error_category *category)

{
  bool bVar1;
  char *message;
  AssertHelper local_b8;
  Message local_b0 [2];
  system_error *anon_var_0;
  type e;
  byte local_61;
  undefined1 local_60 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  anon_class_24_3_a52091c5 f;
  error_category *category_local;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psStack_18;
  int err_local;
  anon_class_16_2_0e9a3be1 test_fn_local;
  
  test_fn_local.r0index =
       (shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)test_fn.t2;
  psStack_18 = test_fn.r0index;
  gtest_msg.value.field_2._8_8_ = &stack0xffffffffffffffe8;
  memset(local_60,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_60);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_60);
  if (bVar1) {
    local_61 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      check_for_error<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp:1808:13)>
      ::anon_class_24_3_a52091c5::operator()
                ((anon_class_24_3_a52091c5 *)((long)&gtest_msg.value.field_2 + 8));
    }
    if ((local_61 & 1) != 0) goto LAB_001e45f6;
    std::__cxx11::string::operator=
              ((string *)local_60,
               "Expected: f () throws an exception of type std::system_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_b0);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,message);
  testing::internal::AssertHelper::operator=(&local_b8,local_b0);
  testing::internal::AssertHelper::~AssertHelper(&local_b8);
  testing::Message::~Message(local_b0);
LAB_001e45f6:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_60);
  return;
}

Assistant:

void check_for_error (Function test_fn, int err, std::error_category const & category) {
#ifdef PSTORE_EXCEPTIONS
    auto f = [&] () {
        try {
            test_fn ();
        } catch (std::system_error const & ex) {
            EXPECT_EQ (category, ex.code ().category ());
            EXPECT_EQ (err, ex.code ().value ());
            throw;
        }
    };
    EXPECT_THROW (f (), std::system_error);
#else
    (void) test_fn;
    (void) err;
    (void) category;
#endif // PSTORE_EXCEPTIONS
}